

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocks5socketengine.cpp
# Opt level: O2

bool __thiscall
QSocks5SocketEngine::waitForWrite(QSocks5SocketEngine *this,QDeadlineTimer deadline,bool *timedOut)

{
  long lVar1;
  QSocks5SocketEnginePrivate *this_00;
  bool bVar2;
  SocketState SVar3;
  long lVar4;
  ulong uVar5;
  QTcpSocket *pQVar6;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QSocks5SocketEnginePrivate **)(this + 8);
  bVar2 = QSocks5SocketEnginePrivate::waitForConnected(this_00,deadline,timedOut);
  if (bVar2) {
    SVar3 = QAbstractSocket::state(&this_00->data->controlSocket->super_QAbstractSocket);
    if (SVar3 == UnconnectedState) {
      bVar2 = true;
    }
    else {
      lVar4 = (**(code **)(*(long *)&this_00->data->controlSocket->super_QAbstractSocket + 0xa8))();
      if (lVar4 == 0) goto LAB_002220b0;
      pQVar6 = this_00->data->controlSocket;
      uVar5 = QDeadlineTimer::remainingTime();
      while( true ) {
        (**(code **)(*(long *)&pQVar6->super_QAbstractSocket + 0xc0))(pQVar6,uVar5 & 0xffffffff);
LAB_002220b0:
        uVar5 = QDeadlineTimer::remainingTime();
        if ((long)uVar5 < 1) break;
        SVar3 = QAbstractSocket::state(&this_00->data->controlSocket->super_QAbstractSocket);
        if (SVar3 != ConnectedState) break;
        lVar4 = (**(code **)(*(long *)&this_00->data->controlSocket->super_QAbstractSocket + 0xa8))
                          ();
        if (lVar4 < 0x20000) break;
        pQVar6 = this_00->data->controlSocket;
      }
      lVar4 = (**(code **)(*(long *)&this_00->data->controlSocket->super_QAbstractSocket + 0xa8))();
      bVar2 = lVar4 < 0x20000;
    }
  }
  else {
    bVar2 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QSocks5SocketEngine::waitForWrite(QDeadlineTimer deadline, bool *timedOut)
{
    Q_D(QSocks5SocketEngine);
    QSOCKS5_DEBUG << "waitForWrite" << deadline.remainingTimeAsDuration();

    // are we connected yet?
    if (!d->waitForConnected(deadline, timedOut))
        return false;
    if (d->data->controlSocket->state() == QAbstractSocket::UnconnectedState)
        return true;

    // we're connected

    // flush any bytes we may still have buffered in the time that we have left
    if (d->data->controlSocket->bytesToWrite())
        d->data->controlSocket->waitForBytesWritten(deadline.remainingTime());

    auto shouldWriteBytes = [&]() {
        return d->data->controlSocket->state() == QAbstractSocket::ConnectedState
                && d->data->controlSocket->bytesToWrite() >= MaxWriteBufferSize;
    };

    qint64 remainingTime = deadline.remainingTime();
    for (; remainingTime > 0 && shouldWriteBytes(); remainingTime = deadline.remainingTime())
        d->data->controlSocket->waitForBytesWritten(remainingTime);
    return d->data->controlSocket->bytesToWrite() < MaxWriteBufferSize;
}